

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

Track * __thiscall mkvmuxer::Segment::AddTrack(Segment *this,int32_t number)

{
  bool bVar1;
  Track *track;
  uint64 uVar2;
  
  track = (Track *)operator_new(0x78,(nothrow_t *)&std::nothrow);
  if (track == (Track *)0x0) {
    track = (Track *)0x0;
  }
  else {
    track->_vptr_Track = (_func_int **)&PTR__AudioTrack_0013f9b8;
    track->codec_id_ = (char *)0x0;
    track->codec_private_ = (uint8_t *)0x0;
    track->language_ = (char *)0x0;
    track->max_block_additional_id_ = 0;
    track->name_ = (char *)0x0;
    track->number_ = 0;
    track->type_ = 0;
    uVar2 = MakeUID(&this->seed_);
    track->uid_ = uVar2;
    track->codec_delay_ = 0;
    track->seek_pre_roll_ = 0;
    track->default_duration_ = 0;
    track->codec_private_length_ = 0;
    *(undefined8 *)((long)&track->codec_private_length_ + 4) = 0;
    *(undefined8 *)((long)&track->content_encoding_entries_ + 4) = 0;
  }
  if (track != (Track *)0x0) {
    bVar1 = Tracks::AddTrack(&this->tracks_,track,number);
    if (bVar1) {
      return track;
    }
    (*track->_vptr_Track[1])(track);
  }
  return (Track *)0x0;
}

Assistant:

Track* Segment::AddTrack(int32_t number) {
  Track* const track = new (std::nothrow) Track(&seed_);  // NOLINT

  if (!track)
    return NULL;

  if (!tracks_.AddTrack(track, number)) {
    delete track;
    return NULL;
  }

  return track;
}